

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O2

Enumerator * __thiscall CParse::newEnumerator(CParse *this,string *ident)

{
  Enumerator *this_00;
  Enumerator *res;
  
  this_00 = (Enumerator *)operator_new(0x30);
  Enumerator::Enumerator(this_00,ident);
  res = this_00;
  std::__cxx11::list<Enumerator_*,_std::allocator<Enumerator_*>_>::push_back(&this->enum_alloc,&res)
  ;
  return res;
}

Assistant:

Enumerator *CParse::newEnumerator(const string &ident)

{
  Enumerator *res = new Enumerator(ident);
  enum_alloc.push_back(res);
  return res;
}